

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O2

void __thiscall
miniros::ServicePublication::removeServiceClientLink
          (ServicePublication *this,ServiceClientLinkPtr *link)

{
  __normal_iterator<std::shared_ptr<miniros::ServiceClientLink>_*,_std::vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>_>
  __position;
  
  std::mutex::lock(&this->client_links_mutex_);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<miniros::ServiceClientLink>*,std::vector<std::shared_ptr<miniros::ServiceClientLink>,std::allocator<std::shared_ptr<miniros::ServiceClientLink>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<miniros::ServiceClientLink>const>>
                         ((this->client_links_).
                          super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->client_links_).
                          super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,link);
  if (__position._M_current !=
      (this->client_links_).
      super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
    ::erase(&this->client_links_,(const_iterator)__position._M_current);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->client_links_mutex_);
  return;
}

Assistant:

void ServicePublication::removeServiceClientLink(const ServiceClientLinkPtr& link)
{
  std::scoped_lock<std::mutex> lock(client_links_mutex_);

  auto it = std::find(client_links_.begin(), client_links_.end(), link);
  if (it != client_links_.end())
  {
    client_links_.erase(it);
  }
}